

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceMgr.cpp
# Opt level: O0

void __thiscall
llvm::SourceMgr::PrintMessage
          (SourceMgr *this,raw_ostream *OS,SMLoc Loc,DiagKind Kind,Twine *Msg,
          ArrayRef<llvm::SMRange> Ranges,ArrayRef<llvm::SMFixIt> FixIts,bool ShowColors)

{
  SMDiagnostic local_1a0;
  byte local_31;
  Twine *pTStack_30;
  bool ShowColors_local;
  Twine *Msg_local;
  raw_ostream *prStack_20;
  DiagKind Kind_local;
  raw_ostream *OS_local;
  SourceMgr *this_local;
  SMLoc Loc_local;
  
  local_31 = ShowColors;
  pTStack_30 = Msg;
  Msg_local._4_4_ = Kind;
  prStack_20 = OS;
  OS_local = (raw_ostream *)this;
  this_local = (SourceMgr *)Loc.Ptr;
  GetMessage(&local_1a0,this,Loc,Kind,Msg,Ranges,FixIts);
  PrintMessage(this,OS,&local_1a0,(bool)(local_31 & 1));
  SMDiagnostic::~SMDiagnostic(&local_1a0);
  return;
}

Assistant:

void SourceMgr::PrintMessage(raw_ostream &OS, SMLoc Loc,
                             SourceMgr::DiagKind Kind,
                             const Twine &Msg, ArrayRef<SMRange> Ranges,
                             ArrayRef<SMFixIt> FixIts, bool ShowColors) const {
  PrintMessage(OS, GetMessage(Loc, Kind, Msg, Ranges, FixIts), ShowColors);
}